

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerHLSL::emit_interface_block_member_in_struct
          (CompilerHLSL *this,SPIRVariable *var,uint32_t member_index,uint32_t location,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *active_locations)

{
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_00;
  bool bVar1;
  uint32_t uVar2;
  SPIREntryPoint *pSVar3;
  SPIRType *pSVar4;
  Bitset *pBVar5;
  __hashtable *__h_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_2;
  __hashtable *__h;
  __alloc_node_gen_t __alloc_node_gen;
  __hashtable_alloc local_260 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  string mbr_name;
  string semantic;
  Bitset member_decorations;
  SPIRType type;
  
  pSVar3 = Compiler::get_entry_point((Compiler *)this);
  pSVar4 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr +
                      *(uint *)&(var->super_IVariant).field_0xc);
  SPIRType::SPIRType(&type,pSVar4);
  ts_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)var->storage;
  to_semantic_abi_cxx11_(&semantic,this,location,pSVar3->model,var->storage);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
            (&member_decorations,this,(ulong)type.super_IVariant.self.id,1);
  CompilerGLSL::to_member_name_abi_cxx11_
            ((string *)&__alloc_node_gen,&this->super_CompilerGLSL,&type,member_index);
  join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string>
            (&mbr_name,(spirv_cross *)&member_decorations,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2c1f55,
             (char (*) [2])&__alloc_node_gen,ts_2);
  if (__alloc_node_gen._M_h != local_260) {
    operator_delete(__alloc_node_gen._M_h);
  }
  if ((size_type *)member_decorations.lower != &member_decorations.higher._M_h._M_bucket_count) {
    operator_delete((void *)member_decorations.lower);
  }
  pSVar4 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr +
                      type.member_types.
                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                      [member_index].id);
  pBVar5 = Compiler::get_member_decoration_bitset
                     ((Compiler *)this,(TypeID)type.super_IVariant.self.id,member_index);
  member_decorations.lower = pBVar5->lower;
  this_00 = &member_decorations.higher;
  member_decorations.higher._M_h._M_buckets = (__buckets_ptr)0x0;
  member_decorations.higher._M_h._M_bucket_count = (pBVar5->higher)._M_h._M_bucket_count;
  member_decorations.higher._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  member_decorations.higher._M_h._M_element_count = (pBVar5->higher)._M_h._M_element_count;
  member_decorations.higher._M_h._M_rehash_policy._M_max_load_factor =
       (pBVar5->higher)._M_h._M_rehash_policy._M_max_load_factor;
  member_decorations.higher._M_h._M_rehash_policy._4_4_ =
       *(undefined4 *)&(pBVar5->higher)._M_h._M_rehash_policy.field_0x4;
  member_decorations.higher._M_h._M_rehash_policy._M_next_resize =
       (pBVar5->higher)._M_h._M_rehash_policy._M_next_resize;
  member_decorations.higher._M_h._M_single_bucket = (__node_base_ptr)0x0;
  __alloc_node_gen._M_h = (__hashtable_alloc *)this_00;
  ::std::
  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_assign<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
            ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)this_00,&(pBVar5->higher)._M_h,&__alloc_node_gen);
  bVar1 = Compiler::has_decoration
                    ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationPerVertexKHR);
  if (bVar1) {
    local_250._M_dataplus._M_p._0_4_ = 0x14a5;
    __alloc_node_gen._M_h = (__hashtable_alloc *)this_00;
    ::std::
    _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
              ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)this_00);
  }
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x36])
            (&__alloc_node_gen,this,&member_decorations);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_250,this,pSVar4,0);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x27])
            (&local_230,this,pSVar4,(ulong)(var->super_IVariant).self.id);
  CompilerGLSL::
  statement<std::__cxx11::string,std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
            (&this->super_CompilerGLSL,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__alloc_node_gen,
             &local_250,(char (*) [2])0x2be236,&mbr_name,&local_230,(char (*) [4])0x2c4b84,&semantic
             ,(char (*) [2])0x2d6cfb);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_250._M_dataplus._M_p._4_4_,(uint32_t)local_250._M_dataplus._M_p) !=
      &local_250.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_250._M_dataplus._M_p._4_4_,(uint32_t)local_250._M_dataplus._M_p))
    ;
  }
  if (__alloc_node_gen._M_h != local_260) {
    operator_delete(__alloc_node_gen._M_h);
  }
  uVar2 = type_to_consumed_locations(this,pSVar4);
  if (uVar2 != 0) {
    do {
      __alloc_node_gen._M_h = (__hashtable_alloc *)active_locations;
      local_250._M_dataplus._M_p._0_4_ = location;
      ::std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)active_locations,&local_250,&__alloc_node_gen);
      location = location + 1;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&this_00->_M_h);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)mbr_name._M_dataplus._M_p != &mbr_name.field_2) {
    operator_delete(mbr_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)semantic._M_dataplus._M_p != &semantic.field_2) {
    operator_delete(semantic._M_dataplus._M_p);
  }
  type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_00360128;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&type.member_name_cache._M_h);
  type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0;
  if ((AlignedBuffer<unsigned_int,_8UL> *)
      type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr !=
      &type.member_type_index_redirection.stack_storage) {
    free(type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr);
  }
  type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size = 0;
  if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
      type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr !=
      &type.member_types.stack_storage) {
    free(type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr);
  }
  type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
  if ((AlignedBuffer<bool,_8UL> *)type.array_size_literal.super_VectorView<bool>.ptr !=
      &type.array_size_literal.stack_storage) {
    free(type.array_size_literal.super_VectorView<bool>.ptr);
  }
  type.array.super_VectorView<unsigned_int>.buffer_size = 0;
  if ((AlignedBuffer<unsigned_int,_8UL> *)type.array.super_VectorView<unsigned_int>.ptr !=
      &type.array.stack_storage) {
    free(type.array.super_VectorView<unsigned_int>.ptr);
  }
  return;
}

Assistant:

void CompilerHLSL::emit_interface_block_member_in_struct(const SPIRVariable &var, uint32_t member_index,
                                                         uint32_t location,
                                                         std::unordered_set<uint32_t> &active_locations)
{
	auto &execution = get_entry_point();
	auto type = get<SPIRType>(var.basetype);
	auto semantic = to_semantic(location, execution.model, var.storage);
	auto mbr_name = join(to_name(type.self), "_", to_member_name(type, member_index));
	auto &mbr_type = get<SPIRType>(type.member_types[member_index]);

	Bitset member_decorations = get_member_decoration_bitset(type.self, member_index);
	if (has_decoration(var.self, DecorationPerVertexKHR))
		member_decorations.set(DecorationPerVertexKHR);

	statement(to_interpolation_qualifiers(member_decorations),
	          type_to_glsl(mbr_type),
	          " ", mbr_name, type_to_array_glsl(mbr_type, var.self),
	          " : ", semantic, ";");

	// Structs and arrays should consume more locations.
	uint32_t consumed_locations = type_to_consumed_locations(mbr_type);
	for (uint32_t i = 0; i < consumed_locations; i++)
		active_locations.insert(location + i);
}